

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O2

string * handle_ladder_page_abi_cxx11_(string_view query_string)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_table;
  undefined8 *puVar1;
  size_t in_default_result;
  undefined8 *puVar2;
  uchar format;
  bool bVar3;
  unsigned_long index;
  unsigned_long count;
  string *psVar4;
  undefined8 *puVar5;
  LadderDatabase *db;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view sVar6;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  char *in_stack_ffffffffffffff70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  parsed_query;
  
  sVar6._M_len._7_1_ = in_stack_ffffffffffffff6f;
  sVar6._M_len._0_7_ = in_stack_ffffffffffffff68;
  sVar6._M_str = in_stack_ffffffffffffff70;
  parse_query_string_abi_cxx11_(sVar6);
  db = RenX::default_ladder_database;
  in_default_result = pluginInstance.entries_per_page;
  in_table = &parsed_query.second;
  if (parsed_query.second._M_h._M_element_count == 0) {
    format = 0xff;
    index = 0;
    count = pluginInstance.entries_per_page;
  }
  else {
    key._M_str = "format";
    key._M_len = 6;
    format = from_table_value<unsigned_char>(in_table,key,0xff);
    key_00._M_str = "start";
    key_00._M_len = 5;
    index = from_table_value<unsigned_long>(in_table,key_00,0);
    key_01._M_str = "count";
    key_01._M_len = 5;
    count = from_table_value<unsigned_long>(in_table,key_01,in_default_result);
    key_02._M_str = "database";
    key_02._M_len = 8;
    sVar6 = get_table_value(in_table,key_02,(string_view)ZEXT816(0));
    if (sVar6._M_len != 0) {
      puVar1 = (undefined8 *)RenX::ladder_databases[1];
      puVar2 = (undefined8 *)*RenX::ladder_databases;
      do {
        puVar5 = puVar2;
        if (puVar5 == puVar1) goto LAB_0010e413;
        lhs = (basic_string_view<char,_std::char_traits<char>_>)RenX::LadderDatabase::getName();
        bVar3 = jessilib::equalsi<char,char>(lhs,sVar6);
        puVar2 = puVar5 + 1;
      } while (!bVar3);
      db = (LadderDatabase *)*puVar5;
    }
  }
  if (db == (LadderDatabase *)0x0) {
LAB_0010e413:
    psVar4 = generate_no_db_page_abi_cxx11_(in_table);
  }
  else {
    psVar4 = RenX_Ladder_WebPlugin::generate_ladder_page_abi_cxx11_
                       (&pluginInstance,db,format,index,count,in_table);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::~pair(&parsed_query);
  return psVar4;
}

Assistant:

std::string* handle_ladder_page(std::string_view query_string) {
	auto parsed_query = parse_query_string(query_string);
	auto& table = parsed_query.second;
	RenX::LadderDatabase *db = RenX::default_ladder_database;
	size_t start_index = 0, count = pluginInstance.getEntriesPerPage();
	uint8_t format = 0xFF;

	if (table.size() != 0) {
		format = from_table_value<uint8_t>(table, "format"sv, format);
		start_index = from_table_value<size_t>(table, "start"sv, start_index);
		count = from_table_value<size_t>(table, "count"sv, count);
		
		std::string_view db_name = get_table_value(table, "database"sv, {});
		if (!db_name.empty()) {
			db = nullptr;
			for (const auto& database : RenX::ladder_databases) {
				if (jessilib::equalsi(std::string_view{database->getName()}, db_name)) {
					db = database;
					break;
				}
			}
		}
	}

	if (db == nullptr) {
		return generate_no_db_page(table);
	}

	return pluginInstance.generate_ladder_page(db, format, start_index, count, table);
}